

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O2

bool poll_process_memory_usage(pid_t pid,ProcessStats *stats)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  longlong values [3];
  char path [1024];
  undefined1 auStack_448 [8];
  long local_440;
  long local_438 [2];
  char local_428 [1032];
  
  bVar5 = false;
  snprintf(local_428,0x400,"/proc/%d/statm",pid);
  __stream = fopen(local_428,"r");
  if (__stream != (FILE *)0x0) {
    bVar5 = false;
    iVar1 = __isoc99_fscanf(__stream,"%lld %lld %lld",auStack_448,&local_440,local_438);
    fclose(__stream);
    if (iVar1 == 3) {
      iVar1 = getpagesize();
      lVar2 = (local_440 * iVar1) / 0x100000;
      lVar3 = (iVar1 * local_438[0]) / 0x100000;
      if (0xfffffffe < lVar2) {
        lVar2 = 0xffffffff;
      }
      lVar4 = 0xffffffff;
      if (lVar3 < 0xffffffff) {
        lVar4 = lVar3;
      }
      stats->resident_mib = (uint32_t)lVar2;
      stats->shared_mib = (uint32_t)lVar4;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

static bool poll_process_memory_usage(pid_t pid, ExternalReplayer::ProcessStats &stats)
{
	long long values[3];
	char path[1024];
	snprintf(path, sizeof(path), "/proc/%d/statm", pid);
	FILE *file = fopen(path, "r");
	if (!file)
		return false;

	if (fscanf(file, "%lld %lld %lld",
	           &values[0], &values[1], &values[2]) != 3)
	{
		fclose(file);
		return false;
	}
	fclose(file);

	int64_t resident = (values[1] * getpagesize()) / (1024 * 1024);
	int64_t shared = (values[2] * getpagesize()) / (1024 * 1024);
	if (resident > UINT32_MAX)
		resident = UINT32_MAX;
	if (shared > UINT32_MAX)
		shared = UINT32_MAX;

	stats.resident_mib = resident;
	stats.shared_mib = shared;
	return true;
}